

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_pubkey_parse
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *input,size_t inputlen)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  char *pcVar5;
  secp256k1_ge Q;
  secp256k1_fe local_f0;
  secp256k1_fe x;
  secp256k1_fe x_1;
  secp256k1_fe local_60;
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/secp256k1.c"
            ,0x128,"test condition failed: ctx != NULL");
    abort();
  }
  if (pubkey == (secp256k1_pubkey *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "pubkey != NULL";
  }
  else {
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
    if (input != (uchar *)0x0) {
      if (inputlen == 0x41) {
        if (7 < *input) {
          return 0;
        }
        if ((0xd0U >> (*input & 0x1f) & 1) == 0) {
          return 0;
        }
        iVar2 = secp256k1_fe_set_b32_limit(&x_1,input + 1);
        iVar1 = 0;
        if (((iVar2 != 0) &&
            (iVar2 = secp256k1_fe_set_b32_limit(&local_f0,input + 0x21), iVar2 != 0)) &&
           ((secp256k1_ge_set_xy(&Q,&x_1,&local_f0), (*input & 0xfe) != 6 ||
            (uVar3 = secp256k1_fe_is_odd(&local_f0), uVar3 == (*input == '\a'))))) {
          secp256k1_ge_verify(&Q);
          iVar1 = 0;
          if (Q.infinity == 0) {
            secp256k1_fe_sqr(&x,&Q.y);
            secp256k1_fe_sqr(&local_60,&Q.x);
            secp256k1_fe_mul(&local_60,&local_60,&Q.x);
            secp256k1_fe_add_int(&local_60,2);
            iVar1 = secp256k1_fe_equal_var(&x,&local_60);
          }
        }
      }
      else {
        if (inputlen != 0x21) {
          return 0;
        }
        if ((*input & 0xfe) != 2) {
          return 0;
        }
        iVar1 = secp256k1_fe_set_b32_limit(&x,input + 1);
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          iVar1 = secp256k1_ge_set_xo_var(&Q,&x,(uint)(*input == '\x03'));
        }
      }
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_ge_is_in_correct_subgroup(&Q);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_pubkey_save(pubkey,&Q);
      secp256k1_ge_clear(&Q);
      return 1;
    }
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "input != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar5,pvVar4);
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_parse(const secp256k1_context* ctx, secp256k1_pubkey* pubkey, const unsigned char *input, size_t inputlen) {
    secp256k1_ge Q;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(input != NULL);
    if (!secp256k1_eckey_pubkey_parse(&Q, input, inputlen)) {
        return 0;
    }
    if (!secp256k1_ge_is_in_correct_subgroup(&Q)) {
        return 0;
    }
    secp256k1_pubkey_save(pubkey, &Q);
    secp256k1_ge_clear(&Q);
    return 1;
}